

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(void)

{
  reference_wrapper<Buffer> local_d0;
  thread local_c8;
  thread consumeBThread;
  thread local_b8;
  thread consumeAThread;
  thread local_a8;
  thread producerBThread;
  reference_wrapper<Buffer> local_90;
  thread local_88;
  thread producerAThread;
  Buffer buffer;
  
  Buffer::Buffer((Buffer *)&producerAThread);
  local_90 = std::ref<Buffer>((Buffer *)&producerAThread);
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_88,produceA,&local_90,&PRODUCER_A_SLEEP_IN_SECONDS);
  consumeAThread._M_id._M_thread = (id)std::ref<Buffer>((Buffer *)&producerAThread);
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_a8,produceB,(reference_wrapper<Buffer> *)&consumeAThread,
             &PRODUCER_B_SLEEP_IN_SECONDS);
  consumeBThread._M_id._M_thread = (id)std::ref<Buffer>((Buffer *)&producerAThread);
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_b8,consumeA,(reference_wrapper<Buffer> *)&consumeBThread,
             &CONSUMER_A_SLEEP_IN_SECONDS);
  local_d0 = std::ref<Buffer>((Buffer *)&producerAThread);
  std::thread::thread<void(&)(Buffer&,int),std::reference_wrapper<Buffer>,int_const&,void>
            (&local_c8,consumeB,&local_d0,&CONSUMER_B_SLEEP_IN_SECONDS);
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&local_c8);
  std::thread::~thread(&local_b8);
  std::thread::~thread(&local_a8);
  std::thread::~thread(&local_88);
  Buffer::~Buffer((Buffer *)&producerAThread);
  return 0;
}

Assistant:

int main() {
    Buffer buffer;

    auto producerAThread = std::thread(produceA, std::ref(buffer), PRODUCER_A_SLEEP_IN_SECONDS);
    auto producerBThread = std::thread(produceB, std::ref(buffer), PRODUCER_B_SLEEP_IN_SECONDS);
    auto consumeAThread = std::thread(consumeA, std::ref(buffer), CONSUMER_A_SLEEP_IN_SECONDS);
    auto consumeBThread = std::thread(consumeB, std::ref(buffer), CONSUMER_B_SLEEP_IN_SECONDS);

    producerAThread.join();
    producerBThread.join();
    consumeAThread.join();
    consumeBThread.join();
    return 0;
}